

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O3

bool amrex::Amr::isDerivePlotVar(string *name)

{
  pointer __s2;
  size_t __n;
  int iVar1;
  undefined8 *puVar2;
  
  if ((undefined8 **)derive_plot_vars_abi_cxx11_ != &derive_plot_vars_abi_cxx11_) {
    __s2 = (name->_M_dataplus)._M_p;
    __n = name->_M_string_length;
    puVar2 = derive_plot_vars_abi_cxx11_;
    do {
      if (puVar2[3] == __n) {
        if (__n == 0) {
          return true;
        }
        iVar1 = bcmp((void *)puVar2[2],__s2,__n);
        if (iVar1 == 0) {
          return true;
        }
      }
      puVar2 = (undefined8 *)*puVar2;
    } while ((undefined8 **)puVar2 != &derive_plot_vars_abi_cxx11_);
  }
  return false;
}

Assistant:

bool
Amr::isDerivePlotVar (const std::string& name) noexcept
{
    for (std::list<std::string>::const_iterator li = derive_plot_vars.begin(), End = derive_plot_vars.end();
         li != End;
         ++li)
    {
        if (*li == name) {
            return true;
        }
    }

    return false;
}